

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.h
# Opt level: O2

bool __thiscall
Clasp::ShortImplicationsGraph::forEach<Clasp::ShortImplicationsGraph::ReverseArc>
          (ShortImplicationsGraph *this,Literal p,ReverseArc *op)

{
  uint uVar1;
  uint uVar2;
  Literal x;
  buf_type *pbVar3;
  bool bVar4;
  buf_type *pbVar5;
  ulong uVar6;
  Literal *pLVar7;
  ImplicationList *this_00;
  __pointer_type pBVar8;
  
  this_00 = (this->graph_).ebo_.buf + (p.rep_ >> 1);
  bVar4 = ImplicationList::empty(this_00);
  if (bVar4) {
    return true;
  }
  pbVar3 = (this_00->super_ImpListBase).super_type.
           super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.buf_;
  uVar1 = (this_00->super_ImpListBase).super_type.
          super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_;
  uVar2 = (this_00->super_ImpListBase).super_type.
          super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.left_;
  uVar6 = 0;
  while (uVar2 != uVar6) {
    bVar4 = ReverseArc::unary(op,p,(Literal)*(uint32 *)(pbVar3 + uVar6));
    uVar6 = uVar6 + 4;
    if (!bVar4) {
      return false;
    }
  }
  pbVar5 = (this_00->super_ImpListBase).super_type.
           super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.buf_ +
           (*(uint *)&(this_00->super_ImpListBase).super_type.
                      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>
                      .field_0x8 & 0x7fffffff);
  while (pbVar5 != pbVar3 + uVar1) {
    bVar4 = ReverseArc::binary(op,p,(Literal)*(uint32 *)(pbVar5 + -8),
                               (Literal)*(uint32 *)(pbVar5 + -4));
    pbVar5 = pbVar5 + -8;
    if (!bVar4) {
      return false;
    }
  }
  pBVar8 = (this_00->learnt)._M_b._M_p;
  do {
    if (pBVar8 == (__pointer_type)0x0) {
      return true;
    }
    pLVar7 = pBVar8->data;
    uVar1 = (pBVar8->size_lock).super___atomic_base<unsigned_int>._M_i;
    while (pLVar7 != pBVar8->data + (uVar1 >> 1)) {
      x.rep_ = pLVar7->rep_;
      if ((x.rep_ & 1) == 0) {
        bVar4 = ReverseArc::binary(op,(Literal)(p.rep_ | 1),x,(Literal)pLVar7[1].rep_);
        pLVar7 = pLVar7 + 2;
      }
      else {
        bVar4 = ReverseArc::unary(op,(Literal)(p.rep_ | 1),x);
        pLVar7 = pLVar7 + 1;
      }
      if (bVar4 == false) {
        return false;
      }
    }
    pBVar8 = (pBVar8->next)._M_b._M_p;
  } while( true );
}

Assistant:

bool forEach(Literal p, const OP& op) const {
		const ImplicationList& x = graph_[p.id()];
		if (x.empty()) return true;
		ImplicationList::const_right_iterator rEnd = x.right_end(); // prefetch
		for (ImplicationList::const_left_iterator it = x.left_begin(), end = x.left_end(); it != end; ++it) {
			if (!op.unary(p, *it)) { return false; }
		}
		for (ImplicationList::const_right_iterator it = x.right_begin(); it != rEnd; ++it) {
			if (!op.binary(p, it->first, it->second)) { return false; }
		}
#if CLASP_HAS_THREADS
		for (Block* b = (x).learnt; b ; b = b->next) {
			p.flag(); bool r = true;
			for (Block::const_iterator imp = b->begin(), endOf = b->end(); imp != endOf; ) {
				if (!imp->flagged()) { r = op.binary(p, imp[0], imp[1]); imp += 2; }
				else                 { r = op.unary(p, imp[0]);          imp += 1; }
				if (!r)              { return false; }
			}
		}
#endif
		return true;
	}